

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_example.cpp
# Opt level: O1

int main(void)

{
  undefined8 in_RAX;
  ostream *this;
  int iVar1;
  undefined8 uStack_28;
  
  iVar1 = base_id<my_id_t>::next_value + 1;
  base_id<my_other_id_t>::next_value = base_id<my_other_id_t>::next_value + 1;
  base_id<my_id_t>::next_value = iVar1;
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Both of these should show 0 : ",0x1e);
  std::ostream::operator<<((ostream *)&std::cout,iVar1);
  uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
  this = std::__ostream_insert<char,std::char_traits<char>>
                   ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
  std::ostream::operator<<((ostream *)this,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\n",1);
  iVar1 = base_id<my_other_id_t>::next_value + 1;
  base_id<my_other_id_t>::next_value = iVar1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"This should be 1 : ",0x13);
  std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return 0;
}

Assistant:

int main() {

    my_id_t id_1 = my_id_t::get_next_id();
    my_other_id_t id_o_1 = my_other_id_t::get_next_id();

    auto id_2 = id_1;

    std::cout << "Both of these should show 0 : " << id_1 << ' ' << id_2 << "\n";

    auto id_o_2 = my_other_id_t::get_next_id();

    std::cout << "This should be 1 : " << id_o_2 << "\n";

    // This should fail to compile
    // id_o_2 = id_1;
}